

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCCof.c
# Opt level: O3

int Gia_ManCofOneDerive(Ccf_Man_t *p,int LitProp)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  Gia_Man_t *p_00;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  uint *puVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  
  pVVar2 = p->vCopies;
  uVar13 = p->pFrames->nObjs;
  if (pVVar2->nCap < (int)uVar13) {
    if (pVVar2->pArray == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar13 << 2);
    }
    else {
      piVar5 = (int *)realloc(pVVar2->pArray,(long)(int)uVar13 << 2);
    }
    pVVar2->pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar2->nCap = uVar13;
  }
  if (0 < (int)uVar13) {
    memset(pVVar2->pArray,0xff,(ulong)uVar13 * 4);
  }
  pVVar2->nSize = uVar13;
  if (LitProp < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar13 = (uint)LitProp >> 1;
  Gia_ManCofOneDerive_rec(p,uVar13);
  if (p->vCopies->nSize <= (int)uVar13) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar13 = p->vCopies->pArray[uVar13];
  if ((int)uVar13 < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x132,"int Abc_LitNotCond(int, int)");
  }
  p_00 = p->pFrames;
  uVar9 = uVar13 >> 1;
  uVar1 = p_00->nObjs;
  if ((int)uVar1 <= (int)uVar9) {
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
  }
  pGVar6 = p_00->pObjs;
  if ((~*(uint *)(pGVar6 + uVar9) & 0x1fffffff) != 0 && (int)*(uint *)(pGVar6 + uVar9) < 0) {
    __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
  }
  if (uVar1 != p_00->nObjsAlloc) goto LAB_00715985;
  uVar4 = uVar1 * 2;
  if (0x1fffffff < (int)(uVar1 * 2)) {
    uVar4 = 0x20000000;
  }
  if (uVar1 == 0x20000000) {
    puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
    exit(1);
  }
  if ((int)uVar4 <= (int)uVar1) {
    __assert_fail("p->nObjs < nObjNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x289,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
  }
  uVar12 = (ulong)uVar4;
  if (p_00->fVerbose == 0) {
LAB_00715917:
    pGVar6 = (Gia_Obj_t *)realloc(pGVar6,uVar12 * 0xc);
    iVar10 = p_00->nObjsAlloc;
  }
  else {
    printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar1,(ulong)uVar4);
    iVar10 = p_00->nObjsAlloc;
    if (iVar10 < 1) {
      __assert_fail("p->nObjsAlloc > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x28c,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
    }
    pGVar6 = p_00->pObjs;
    if (pGVar6 != (Gia_Obj_t *)0x0) goto LAB_00715917;
    pGVar6 = (Gia_Obj_t *)malloc(uVar12 * 0xc);
  }
  p_00->pObjs = pGVar6;
  memset(pGVar6 + iVar10,0,(long)(int)(uVar4 - iVar10) * 0xc);
  if (p_00->pMuxes != (uint *)0x0) {
    puVar7 = (uint *)realloc(p_00->pMuxes,uVar12 << 2);
    p_00->pMuxes = puVar7;
    memset(puVar7 + p_00->nObjsAlloc,0,(uVar12 - (long)p_00->nObjsAlloc) * 4);
  }
  p_00->nObjsAlloc = uVar4;
LAB_00715985:
  if ((p_00->vHTable).nSize != 0) {
    Vec_IntPush(&p_00->vHash,0);
  }
  iVar10 = p_00->nObjs;
  p_00->nObjs = iVar10 + 1;
  if ((long)iVar10 < 0) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar6 = p_00->pObjs + iVar10;
  uVar12 = *(ulong *)pGVar6;
  *(ulong *)pGVar6 = uVar12 | 0x80000000;
  pGVar3 = p_00->pObjs;
  if ((pGVar3 <= pGVar6) && (pGVar6 < pGVar3 + p_00->nObjs)) {
    uVar13 = uVar13 ^ LitProp & 1U;
    uVar8 = (ulong)(((uint)((int)pGVar6 - (int)pGVar3) >> 2) * -0x55555555 - uVar9 & 0x1fffffff);
    uVar11 = (ulong)((uVar13 & 1) << 0x1d);
    *(ulong *)pGVar6 = uVar11 | uVar12 & 0xffffffffc0000000 | 0x80000000 | uVar8;
    *(ulong *)pGVar6 =
         uVar11 | uVar12 & 0xe0000000c0000000 | 0x80000000 | uVar8 |
         (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
    pGVar3 = p_00->pObjs;
    if ((pGVar3 <= pGVar6) && (pGVar6 < pGVar3 + p_00->nObjs)) {
      Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar6 - (long)pGVar3) >> 2) * -0x55555555);
      if (p_00->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_00,pGVar6 + -(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff),pGVar6);
      }
      if ((p_00->pObjs <= pGVar6) && (pGVar6 < p_00->pObjs + p_00->nObjs)) {
        Gia_ManCofExtendSolver(p);
        return uVar13 ^ 1;
      }
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_ManCofOneDerive( Ccf_Man_t * p, int LitProp )
{
    int LitOut;
    // derive the cofactor of the property node
    Vec_IntFill( p->vCopies, Gia_ManObjNum(p->pFrames), -1 );
    Gia_ManCofOneDerive_rec( p, Abc_Lit2Var(LitProp) );
    LitOut = Vec_IntEntry( p->vCopies, Abc_Lit2Var(LitProp) );
    LitOut = Abc_LitNotCond( LitOut, Abc_LitIsCompl(LitProp) );
    // add new PO for the cofactor
    Gia_ManAppendCo( p->pFrames, LitOut );
    // add SAT clauses
    Gia_ManCofExtendSolver( p );
    // return negative literal of the cofactor
    return Abc_LitNot(LitOut);
}